

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

bool CLOptionsHelper::file_exists(string *name,bool hard_check)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  byte in_SIL;
  string *in_RDI;
  ifstream f;
  undefined1 local_218 [527];
  byte local_9;
  string *local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_218,pcVar2,_S_in);
  bVar1 = std::ios::good();
  if (((bVar1 & 1) == 0) && ((local_9 & 1) != 0)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ERROR] File does not exist:\n   \"");
    poVar3 = std::operator<<(poVar3,local_8);
    poVar3 = std::operator<<(poVar3,"\"");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::ios::good();
  std::ifstream::~ifstream(local_218);
  return (bool)(bVar1 & 1);
}

Assistant:

static inline bool file_exists (const std::string& name, bool hard_check=true) {
        std::ifstream f( name.c_str() );
        if ( !f.good() && hard_check ) {
            // note that the name is put in quotes to show when
            // extra white space has been added
            std::cout << "[ERROR] File does not exist:\n   \"" << name << "\"" << std::endl;
        }
        return f.good();
    }